

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

bool __thiscall
QCache<QByteArray,_QTzTimeZoneCacheEntry>::insert
          (QCache<QByteArray,_QTzTimeZoneCacheEntry> *this,QByteArray *key,
          QTzTimeZoneCacheEntry *object,qsizetype cost)

{
  long lVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  Node *n;
  long in_FS_OFFSET;
  Value local_68;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->mx;
  if (lVar1 < cost) {
    remove(this,(char *)key);
    if (object != (QTzTimeZoneCacheEntry *)0x0) {
      pDVar2 = (object->m_posixRule).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((object->m_posixRule).d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(object->m_abbreviations).d);
      pDVar3 = (object->m_tranRules).d.d;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((object->m_tranRules).d.d)->super_QArrayData,0xc,0x10);
        }
      }
      pDVar4 = (object->m_tranTimes).d.d;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + -1);
        UNLOCK();
        if ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
            == 0) {
          QArrayData::deallocate(&((object->m_tranTimes).d.d)->super_QArrayData,0x10,0x10);
        }
      }
      operator_delete(object,0x70);
    }
  }
  else {
    trim(this,lVar1 - cost);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHashPrivate::Data<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::findOrInsert<QByteArray>
              ((InsertionResult *)local_58,&this->d,key);
    n = (Node *)((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries +
                (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                [(uint)local_58._8_8_ & 0x7f]);
    if (local_58[0x10] == true) {
      lVar5 = (n->value).cost;
      local_68.t = (n->value).t;
      (n->value).t = object;
      local_68.cost = (n->value).cost;
      (n->value).cost = cost;
      Value::~Value(&local_68);
      relink(this,key);
      lVar5 = cost - lVar5;
    }
    else {
      Node::createInPlace(n,key,object,cost);
      (n->super_Chain).prev = &this->chain;
      (n->super_Chain).next = (this->chain).next;
      ((this->chain).next)->prev = (Chain *)n;
      (this->chain).next = (Chain *)n;
      lVar5 = cost;
    }
    this->total = this->total + lVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cost <= lVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }